

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O1

string * __thiscall
jsoncons::jsonpath::detail::
token<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
::to_string_abi_cxx11_(string *__return_storage_ptr__,void *this,int level)

{
  long *plVar1;
  char cVar2;
  assertion_error *this_00;
  jsonpath_token_kind kind;
  ulong uVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> sbuf;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar2 = (char)level;
  switch(*this) {
  case 0:
    if (0 < level) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                 cVar2 * '\x02');
    }
    goto LAB_00418eab;
  case 1:
    if (0 < level) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                 cVar2 * '\x02');
    }
    goto LAB_00418eab;
  case 2:
    (**(code **)(**(long **)((long)this + 8) + 0x18))(&local_48,*(long **)((long)this + 8),level);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    break;
  default:
    if (0 < level) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                 cVar2 * '\x02');
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    detail::to_string_abi_cxx11_((string *)&local_48,(detail *)(ulong)*this,kind);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    break;
  case 0xd:
    if (0 < level) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                 cVar2 * '\x02');
    }
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::to_string_abi_cxx11_
              (&local_48,
               (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)((long)this + 8))
    ;
    unicode_traits::convert<wchar_t,std::__cxx11::string>
              (local_48._M_dataplus._M_p,local_48._M_string_length,__return_storage_ptr__,strict);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
    uVar3 = local_48.field_2._M_allocated_capacity * 4 + 4;
    goto LAB_00418fb1;
  case 0xe:
    plVar1 = *(long **)((long)this + 8);
    if (plVar1 == (long *)0x0) {
      this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"assertion \'selector_ != nullptr\' failed at  <> :0","");
      assertion_error::assertion_error(this_00,(string *)&local_48);
      __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
    (**(code **)(*plVar1 + 0x28))(&local_48,plVar1,level);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    break;
  case 0xf:
    (**(code **)(**(long **)((long)this + 8) + 0x18))(&local_48,*(long **)((long)this + 8),level);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    break;
  case 0x11:
    if (0 < level) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_replace_aux
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
                 cVar2 * '\x02');
    }
LAB_00418eab:
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  case 0x13:
    (**(code **)(**(long **)((long)this + 8) + 0x18))(&local_48,*(long **)((long)this + 8),level);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    uVar3 = local_48.field_2._M_allocated_capacity + 1;
LAB_00418fb1:
    operator_delete(local_48._M_dataplus._M_p,uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(int level) const
        {
            std::string s;
            switch (token_kind_)
            {
                case jsonpath_token_kind::root_node:
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    s.append("root node");
                    break;
                case jsonpath_token_kind::current_node:
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    s.append("current node");
                    break;
                case jsonpath_token_kind::argument:
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    s.append("argument");
                    break;
                case jsonpath_token_kind::selector:
                    JSONCONS_ASSERT(selector_ != nullptr);
                    s.append(selector_->to_string(level));
                    break;
                case jsonpath_token_kind::expression:
                    s.append(expression_->to_string(level));
                    break;
                case jsonpath_token_kind::literal:
                {
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    auto sbuf = value_.to_string();
                    unicode_traits::convert(sbuf.data(), sbuf.size(), s);
                    break;
                }
                case jsonpath_token_kind::binary_operator:
                    s.append(binary_operator_->to_string(level));
                    break;
                case jsonpath_token_kind::function:
                    s.append(function_->to_string(level));
                    break;
                default:
                    if (level > 0)
                    {
                        s.append("\n");
                        s.append(std::size_t(level)*2, ' ');
                    }
                    s.append("token kind: ");
                    s.append(jsoncons::jsonpath::detail::to_string(token_kind_));
                    break;
            }
            //s.append("\n");
            return s;
        }